

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O1

void __thiscall chrono::ChSystem::ArchiveOUT(ChSystem *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChSystem>(marchive);
  ChAssembly::ArchiveOUT(&this->assembly,marchive);
  local_38._value = (ChVector<double> *)&this->contact_container;
  local_38._name = "contact_container";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChContactContainer>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChContactContainer>_> *)&local_38);
  local_38._value = &this->G_acc;
  local_38._name = "G_acc";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  local_38._value = (ChVector<double> *)&this->ch_time;
  local_38._name = "ch_time";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_38._value = (ChVector<double> *)&this->step;
  local_38._name = "step";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_38._value = (ChVector<double> *)&this->step_min;
  local_38._name = "step_min";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_38._value = (ChVector<double> *)&this->step_max;
  local_38._name = "step_max";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_38._value = (ChVector<double> *)&this->stepcount;
  local_38._name = "stepcount";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[9])(marchive,&local_38);
  local_38._value = (ChVector<double> *)&this->write_matrix;
  local_38._name = "write_matrix";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  local_38._value = (ChVector<double> *)&this->tol_force;
  local_38._name = "tol_force";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_38._value = (ChVector<double> *)&this->maxiter;
  local_38._name = "maxiter";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[3])(marchive,&local_38);
  local_38._value = (ChVector<double> *)&this->use_sleeping;
  local_38._name = "use_sleeping";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  local_38._value = (ChVector<double> *)&this->descriptor;
  local_38._name = "descriptor";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChSystemDescriptor>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChSystemDescriptor>_> *)&local_38);
  local_38._value = (ChVector<double> *)&this->solver;
  local_38._name = "solver";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChSolver>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChSolver>_> *)&local_38);
  local_38._value = (ChVector<double> *)&this->min_bounce_speed;
  local_38._name = "min_bounce_speed";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_38._value = (ChVector<double> *)&this->max_penetration_recovery_speed;
  local_38._name = "max_penetration_recovery_speed";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_38._value = (ChVector<double> *)&this->collision_system;
  local_38._name = "collision_system";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::collision::ChCollisionSystem>
            (marchive,(ChNameValue<std::shared_ptr<chrono::collision::ChCollisionSystem>_> *)
                      &local_38);
  local_38._value = (ChVector<double> *)&this->timestepper;
  local_38._name = "timestepper";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChTimestepper>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChTimestepper>_> *)&local_38);
  return;
}

Assistant:

void ChSystem::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChSystem>();

    // serialize underlying assembly
    assembly.ArchiveOUT(marchive);

    // serialize all member data:

    marchive << CHNVP(contact_container);

    marchive << CHNVP(G_acc);
    marchive << CHNVP(ch_time);
    marchive << CHNVP(step);
    marchive << CHNVP(step_min);
    marchive << CHNVP(step_max);
    marchive << CHNVP(stepcount);
    marchive << CHNVP(write_matrix);

    marchive << CHNVP(tol_force);
    marchive << CHNVP(maxiter);
    marchive << CHNVP(use_sleeping);

    marchive << CHNVP(descriptor);
    marchive << CHNVP(solver);

    marchive << CHNVP(min_bounce_speed);
    marchive << CHNVP(max_penetration_recovery_speed);

    marchive << CHNVP(collision_system);  // ChCollisionSystem should implement class factory for abstract create

    marchive << CHNVP(timestepper);  // ChTimestepper should implement class factory for abstract create

    //***TODO*** complete...
}